

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall MetaCommand::ExportGAD(MetaCommand *this,bool dynamic)

{
  DataEnumType *pDVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  pointer pFVar5;
  undefined7 in_register_00000031;
  char *pcVar6;
  pointer pOVar7;
  string *psVar8;
  OptionVector options;
  string datapath;
  string filename;
  string local_250 [32];
  ofstream file;
  
  std::operator<<((ostream *)&std::cout,"Exporting GAD file...");
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::vector
            (&options,&this->m_OptionVector);
  if ((int)CONCAT71(in_register_00000031,dynamic) != 0) {
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::operator=
              (&options,&this->m_ParsedOptionVector);
  }
  if ((this->m_Name)._M_string_length == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Set the name of the application using SetName()"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    cVar2 = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&filename,(string *)&this->m_Name);
    std::__cxx11::string::append((char *)&filename);
    std::ofstream::ofstream(&file);
    std::ofstream::open((char *)&file,(_Ios_Openmode)filename._M_dataplus._M_p);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
      poVar3 = std::operator<<(poVar3,filename._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      poVar3 = std::operator<<((ostream *)&file,"<?xml version=\"1.0\" encoding=\"UTF-8\" ?>");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"<gridApplication");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,
                               "xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\"");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,
                               "xsi:noNamespaceSchemaLocation=\"grid-application-description.xsd\"")
      ;
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"name=\"");
      poVar3 = std::operator<<(poVar3,(this->m_Name)._M_dataplus._M_p);
      poVar3 = std::operator<<(poVar3,"\"");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"description=\"");
      poVar3 = std::operator<<(poVar3,(this->m_Description)._M_dataplus._M_p);
      poVar3 = std::operator<<(poVar3,"\">");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,
                               "<applicationComponent name=\"Client\" remoteExecution=\"true\">");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"<componentActionList>");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>((ostream *)&file);
      for (pOVar7 = options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pOVar7 != options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
        for (psVar8 = (string *)
                      &((pOVar7->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start)->value;
            (pointer)(psVar8 + -0x40) !=
            (pOVar7->fields).
            super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
            super__Vector_impl_data._M_finish; psVar8 = psVar8 + 0xb0) {
          if (*(int *)(psVar8 + 0x24) == 1) {
            poVar3 = std::operator<<((ostream *)&file,
                                     " <componentAction type=\"DataRelocation\" order=\"");
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,"\">");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"Name\" value=\"");
            poVar3 = std::operator<<(poVar3,psVar8 + -0x40);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"Host\" value=\"hostname\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"Description\" value=\"");
            poVar3 = std::operator<<(poVar3,psVar8 + -0x20);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"Direction\" value=\"In\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"Protocol\" value=\"gsiftp\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"SourceDataPath\" value=\"");
            poVar3 = std::operator<<(poVar3,psVar8);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__cxx11::string::string((string *)&datapath,psVar8);
            lVar4 = std::__cxx11::string::find_last_of((char *)&datapath,0x155501);
            if (lVar4 != 0) {
              std::__cxx11::string::substr((ulong)local_250,(ulong)&datapath);
              std::__cxx11::string::operator=((string *)&datapath,local_250);
              std::__cxx11::string::~string(local_250);
            }
            lVar4 = std::__cxx11::string::find_last_of((char *)&datapath,0x163316);
            if (lVar4 != 0) {
              std::__cxx11::string::substr((ulong)local_250,(ulong)&datapath);
              std::__cxx11::string::operator=((string *)&datapath,local_250);
              std::__cxx11::string::~string(local_250);
            }
            poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"DestDataPath\" value=\"")
            ;
            poVar3 = std::operator<<(poVar3,datapath._M_dataplus._M_p);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file," </componentAction>");
            std::endl<char,std::char_traits<char>>(poVar3);
            std::endl<char,std::char_traits<char>>((ostream *)&file);
            std::__cxx11::string::~string((string *)&datapath);
          }
        }
      }
      poVar3 = std::operator<<((ostream *)&file," <componentAction type=\"JobSubmission\" order=\"")
      ;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"\">");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"Executable\" value=\"");
      poVar3 = std::operator<<(poVar3,(this->m_ExecutableName)._M_dataplus._M_p);
      poVar3 = std::operator<<(poVar3,"\"/>");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<((ostream *)&file,"  <parameter name=\"Arguments\"  value=\"");
      for (pOVar7 = options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pOVar7 != options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
        if (pOVar7 != options.
                      super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
          std::operator<<((ostream *)&file," ");
        }
        poVar3 = std::operator<<((ostream *)&file,"{");
        poVar3 = std::operator<<(poVar3,(pOVar7->name)._M_dataplus._M_p);
        std::operator<<(poVar3,"}");
      }
      poVar3 = std::operator<<((ostream *)&file,"\"/>");
      std::endl<char,std::char_traits<char>>(poVar3);
      for (pOVar7 = options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pOVar7 != options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
        pFVar5 = (pOVar7->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_start;
        while (pFVar5 != (pOVar7->fields).
                         super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
          pDVar1 = &pFVar5->externaldata;
          pFVar5 = pFVar5 + 1;
          if (*pDVar1 != DATA_NONE) goto LAB_00118462;
        }
        poVar3 = std::operator<<((ostream *)&file,"   <group name=\"");
        std::operator<<(poVar3,(pOVar7->name)._M_dataplus._M_p);
        std::operator<<((ostream *)&file,"\" syntax=\"");
        if ((pOVar7->tag)._M_string_length != 0) {
          poVar3 = std::operator<<((ostream *)&file,"-");
          poVar3 = std::operator<<(poVar3,(pOVar7->tag)._M_dataplus._M_p);
          std::operator<<(poVar3," ");
        }
        for (pFVar5 = (pOVar7->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pFVar5 != (pOVar7->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
          if (pFVar5 != (pOVar7->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
            std::operator<<((ostream *)&file," ");
          }
          poVar3 = std::operator<<((ostream *)&file,"{");
          poVar3 = std::operator<<(poVar3,(string *)pOVar7);
          poVar3 = std::operator<<(poVar3,(string *)pFVar5);
          std::operator<<(poVar3,"}");
        }
        std::operator<<((ostream *)&file,"\"");
        if (pOVar7->required == false) {
          std::operator<<((ostream *)&file," optional=\"true\"");
          pcVar6 = " selected=\"false\"";
          if (pOVar7->userDefined != false) {
            pcVar6 = " selected=\"true\"";
          }
          std::operator<<((ostream *)&file,pcVar6);
        }
        poVar3 = std::operator<<((ostream *)&file,">");
        std::endl<char,std::char_traits<char>>(poVar3);
        for (pFVar5 = (pOVar7->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pFVar5 != (pOVar7->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
          poVar3 = std::operator<<((ostream *)&file,"    <argument name=\"");
          poVar3 = std::operator<<(poVar3,(string *)pOVar7);
          std::operator<<(poVar3,(string *)pFVar5);
          poVar3 = std::operator<<((ostream *)&file,"\" value=\"");
          std::operator<<(poVar3,(string *)&pFVar5->value);
          pcVar6 = "\" type=\"";
          poVar3 = std::operator<<((ostream *)&file,"\" type=\"");
          TypeToString_abi_cxx11_(&datapath,(MetaCommand *)pcVar6,pFVar5->type);
          std::operator<<(poVar3,datapath._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&datapath);
          std::operator<<((ostream *)&file,"\"");
          if ((pFVar5->rangeMin)._M_string_length != 0) {
            poVar3 = std::operator<<((ostream *)&file," rangeMin=\"");
            poVar3 = std::operator<<(poVar3,(string *)&pFVar5->rangeMin);
            std::operator<<(poVar3,"\"");
          }
          if ((pFVar5->rangeMax)._M_string_length != 0) {
            poVar3 = std::operator<<((ostream *)&file," rangeMax=\"");
            poVar3 = std::operator<<(poVar3,(string *)&pFVar5->rangeMax);
            std::operator<<(poVar3,"\"");
          }
          poVar3 = std::operator<<((ostream *)&file,"/>");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        poVar3 = std::operator<<((ostream *)&file,"  </group>");
        std::endl<char,std::char_traits<char>>(poVar3);
LAB_00118462:
      }
      poVar3 = std::operator<<((ostream *)&file," </componentAction>");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>((ostream *)&file);
      for (pOVar7 = options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pOVar7 != options.
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
        for (psVar8 = (string *)
                      &((pOVar7->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start)->value;
            (pointer)(psVar8 + -0x40) !=
            (pOVar7->fields).
            super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
            super__Vector_impl_data._M_finish; psVar8 = psVar8 + 0xb0) {
          if (*(int *)(psVar8 + 0x24) == 2) {
            poVar3 = std::operator<<((ostream *)&file,
                                     " <componentAction type=\"DataRelocation\" order=\"");
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,"\">");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"Name\" Value=\"");
            poVar3 = std::operator<<(poVar3,psVar8 + -0x40);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"Host\" Value=\"hostname\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"Description\" value=\"");
            poVar3 = std::operator<<(poVar3,psVar8 + -0x20);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"Direction\" value=\"Out\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"Protocol\" value=\"gsiftp\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__cxx11::string::string((string *)&datapath,psVar8);
            lVar4 = std::__cxx11::string::find_last_of((char *)&datapath,0x155501);
            if (lVar4 != 0) {
              std::__cxx11::string::substr((ulong)local_250,(ulong)&datapath);
              std::__cxx11::string::operator=((string *)&datapath,local_250);
              std::__cxx11::string::~string(local_250);
            }
            lVar4 = std::__cxx11::string::find_last_of((char *)&datapath,0x163316);
            if (lVar4 != 0) {
              std::__cxx11::string::substr((ulong)local_250,(ulong)&datapath);
              std::__cxx11::string::operator=((string *)&datapath,local_250);
              std::__cxx11::string::~string(local_250);
            }
            poVar3 = std::operator<<((ostream *)&file,
                                     "  <parameter name=\"SourceDataPath\" value=\"");
            poVar3 = std::operator<<(poVar3,datapath._M_dataplus._M_p);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file,"  <parameter name=\"DestDataPath\" value=\"")
            ;
            poVar3 = std::operator<<(poVar3,psVar8);
            poVar3 = std::operator<<(poVar3,"\"/>");
            std::endl<char,std::char_traits<char>>(poVar3);
            poVar3 = std::operator<<((ostream *)&file," </componentAction>");
            std::endl<char,std::char_traits<char>>(poVar3);
            std::endl<char,std::char_traits<char>>((ostream *)&file);
            std::__cxx11::string::~string((string *)&datapath);
          }
        }
      }
      poVar3 = std::operator<<((ostream *)&file,"    </componentActionList>");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"  </applicationComponent>");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&file,"</gridApplication>");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ofstream::close();
      poVar3 = std::operator<<((ostream *)&std::cout,"done");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&filename);
  }
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::~vector(&options);
  return (bool)cVar2;
}

Assistant:

bool MetaCommand::ExportGAD(bool dynamic)
{
  METAIO_STREAM::cout << "Exporting GAD file...";

  OptionVector options = m_OptionVector;
  if(dynamic)
    {
    options = m_ParsedOptionVector;
    }

    if (m_Name.empty()) {
      METAIO_STREAM::cout << "Set the name of the application using SetName()"
                          << METAIO_STREAM::endl;
      return false;
    }

  METAIO_STL::string filename = m_Name;
  filename += ".gad.xml";

  METAIO_STREAM::ofstream file;
  file.open(filename.c_str(), METAIO_STREAM::ios::binary | METAIO_STREAM::ios::out);
  if(!file.is_open())
    {
    METAIO_STREAM::cout << "Cannot open file for writing: " << filename.c_str() <<  METAIO_STREAM::endl;
    return false;
    }

    file << R"(<?xml version="1.0" encoding="UTF-8" ?>)" << METAIO_STREAM::endl;
    file << "<gridApplication" << METAIO_STREAM::endl;
    file << "xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\""
         << METAIO_STREAM::endl;
    file << "xsi:noNamespaceSchemaLocation=\"grid-application-description.xsd\""
         << METAIO_STREAM::endl;
    file << "name=\"" << m_Name.c_str() << "\"" << METAIO_STREAM::endl;
    file << "description=\"" << m_Description.c_str() << "\">"
         << METAIO_STREAM::endl;
    file << R"(<applicationComponent name="Client" remoteExecution="true">)"
         << METAIO_STREAM::endl;
    file << "<componentActionList>" << METAIO_STREAM::endl;
    file << METAIO_STREAM::endl;

    unsigned int order = 1;
    // Write out the input data to be transfered
    OptionVector::const_iterator it = options.begin();
    while (it != options.end()) {
      auto itFields = (*it).fields.begin();
      while (itFields != (*it).fields.end()) {
        if ((*itFields).externaldata == DATA_IN) {
          file << R"( <componentAction type="DataRelocation" order=")" << order
               << "\">" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Name" value=")" << (*itFields).name
               << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Host" value="hostname"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="Description" value=")"
               << (*itFields).description << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="Direction" value="In"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="Protocol" value="gsiftp"/>)"
               << METAIO_STREAM::endl;
          file << R"(  <parameter name="SourceDataPath" value=")"
               << (*itFields).value << "\"/>" << METAIO_STREAM::endl;

          METAIO_STL::string datapath = (*itFields).value;
          size_t slash = datapath.find_last_of("/");
          if (slash > 0) {
            datapath = datapath.substr(slash + 1, datapath.size() - slash - 1);
          }
        slash = datapath.find_last_of("\\");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
          file << R"(  <parameter name="DestDataPath" value=")"
               << datapath.c_str() << "\"/>" << METAIO_STREAM::endl;
          file << " </componentAction>" << METAIO_STREAM::endl;
          file << METAIO_STREAM::endl;
          ++order;
        }
      ++itFields;
      }
    ++it;
    }

    file << R"( <componentAction type="JobSubmission" order=")" << order
         << "\">" << METAIO_STREAM::endl;
    file << R"(  <parameter name="Executable" value=")"
         << m_ExecutableName.c_str() << "\"/>" << METAIO_STREAM::endl;
    file << R"(  <parameter name="Arguments"  value=")";
    // Write out the command line arguments
    it = options.begin();
    while (it != options.end()) {
      if (it != options.begin()) {
        file << " ";
      }
    file << "{" << (*it).name.c_str() << "}";
    ++it;
    }
  file << "\"/>" << METAIO_STREAM::endl;
  // Write out the arguments that are not data
  it = options.begin();
  while(it != options.end())
    {
    // Find if this is a non data field
    bool isData = false;
    auto itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if((*itFields).externaldata != DATA_NONE)
        {
        isData = true;
        break;
        }
      ++itFields;
      }

    if(isData)
      {
      ++it;
      continue;
      }

    file << "   <group name=\"" << (*it).name.c_str();
    file << "\" syntax=\"";

    if (!(*it).tag.empty()) {
      file << "-" << (*it).tag.c_str() << " ";
    }

    itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if(itFields != (*it).fields.begin())
        {
        file << " ";
        }
      file << "{" << (*it).name << (*itFields).name << "}";
      ++itFields;
      }
    file << "\"";

    if(!(*it).required)
      {
      file << " optional=\"true\"";

      // Add if the option was selected
      if((*it).userDefined)
        {
        file << " selected=\"true\"";
        }
      else
        {
        file << " selected=\"false\"";
        }
      }

    file << ">" << METAIO_STREAM::endl;

    // Now writes the value of the arguments
    itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      file << "    <argument name=\"" << (*it).name << (*itFields).name;
      file << "\" value=\"" << (*itFields).value;
      file << "\" type=\"" << this->TypeToString((*itFields).type).c_str();
      file << "\"";

      if (!(*itFields).rangeMin.empty()) {
        file << " rangeMin=\"" << (*itFields).rangeMin << "\"";
      }

      if (!(*itFields).rangeMax.empty()) {
        file << " rangeMax=\"" << (*itFields).rangeMax << "\"";
      }
      file << "/>" << METAIO_STREAM::endl;
      ++itFields;
      }
    file << "  </group>" << METAIO_STREAM::endl;
    ++it;
    }
  file << " </componentAction>" << METAIO_STREAM::endl;
  ++order;
  file << METAIO_STREAM::endl;
  // Write out the input data to be transfered
  it = options.begin();
  while(it != options.end())
    {
    auto itFields = (*it).fields.begin();
    while(itFields != (*it).fields.end())
      {
      if((*itFields).externaldata == DATA_OUT)
        {
        file << R"( <componentAction type="DataRelocation" order=")" << order
             << "\">" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Name" Value=")" << (*itFields).name
             << "\"/>" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Host" Value="hostname"/>)"
             << METAIO_STREAM::endl;
        file << R"(  <parameter name="Description" value=")"
             << (*itFields).description << "\"/>" << METAIO_STREAM::endl;
        file << R"(  <parameter name="Direction" value="Out"/>)"
             << METAIO_STREAM::endl;
        file << R"(  <parameter name="Protocol" value="gsiftp"/>)"
             << METAIO_STREAM::endl;
        METAIO_STL::string datapath = (*itFields).value;
        size_t slash = datapath.find_last_of("/");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
        slash = datapath.find_last_of("\\");
        if(slash>0)
          {
          datapath = datapath.substr(slash+1,datapath.size()-slash-1);
          }
          file << R"(  <parameter name="SourceDataPath" value=")"
               << datapath.c_str() << "\"/>" << METAIO_STREAM::endl;
          file << R"(  <parameter name="DestDataPath" value=")"
               << (*itFields).value << "\"/>" << METAIO_STREAM::endl;
          file << " </componentAction>" << METAIO_STREAM::endl;
          file << METAIO_STREAM::endl;
          ++order;
        }
      ++itFields;
      }
    ++it;
    }
  file << "    </componentActionList>" << METAIO_STREAM::endl;
  file << "  </applicationComponent>" << METAIO_STREAM::endl;
  file << "</gridApplication>" << METAIO_STREAM::endl;

  file.close();

  METAIO_STREAM::cout << "done" << METAIO_STREAM::endl;
  return true;
}